

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O2

bool TasOptimization::testGradientDescentState(bool verbose)

{
  vector<double,_std::allocator<double>_> *this;
  pointer pdVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  size_t i;
  long lVar7;
  bool pass;
  allocator_type local_a9;
  vector<double,_std::allocator<double>_> compare_x;
  GradientDescentState state;
  vector<double,_std::allocator<double>_> new_x;
  vector<double,_std::allocator<double>_> dummy_x;
  value_type_conflict1 local_38;
  
  state.adaptive_stepsize = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&dummy_x,5,&state.adaptive_stepsize,(allocator_type *)&compare_x);
  state.adaptive_stepsize = 0.1;
  this = &state.x;
  std::vector<double,_std::allocator<double>_>::vector(this,&dummy_x);
  pdVar4 = state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar2 = state.adaptive_stepsize;
  std::vector<double,_std::allocator<double>_>::vector(&compare_x,this);
  pdVar1 = compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&compare_x.super__Vector_base<double,_std::allocator<double>_>);
  std::vector<double,_std::allocator<double>_>::vector(&compare_x,this);
  pass = ((long)pdVar1 - (long)pdVar5 == 0x28 && (long)pdVar4 - (long)pdVar3 == 0x28) &&
         dVar2 == 0.1;
  lVar6 = (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  for (lVar7 = 0;
      pdVar5 = compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start, lVar6 != lVar7; lVar7 = lVar7 + 1) {
    pass = (bool)(pass & compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7] ==
                         dummy_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7]);
  }
  for (; pdVar5 != compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    *pdVar5 = 0.0;
  }
  if ((long)state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            (long)state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
    lVar6 = (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  }
  for (lVar7 = 0;
      pdVar5 = compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start, lVar6 != lVar7; lVar7 = lVar7 + 1) {
    pass = (bool)(pass & compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7] ==
                         dummy_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7]);
  }
  for (; pdVar5 != compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    *pdVar5 = 0.0;
  }
  std::vector<double,_std::allocator<double>_>::operator=(&compare_x,this);
  for (lVar6 = 0;
      (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != lVar6; lVar6 = lVar6 + 1) {
    pass = (bool)(pass & compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6] ==
                         dummy_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6]);
  }
  local_38 = 2.0;
  std::vector<double,_std::allocator<double>_>::vector(&new_x,5,&local_38,&local_a9);
  GradientDescentState::setX(&state,&new_x);
  std::vector<double,_std::allocator<double>_>::operator=(&compare_x,this);
  for (lVar6 = 0;
      pdVar5 = compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != lVar6; lVar6 = lVar6 + 1) {
    pass = (bool)(pass & new_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6] ==
                         compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6]);
  }
  for (; pdVar5 != compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    *pdVar5 = 0.0;
  }
  if ((long)state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            new_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            (long)state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)state.x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::operator=(&compare_x,this);
  for (lVar6 = 0;
      (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != lVar6; lVar6 = lVar6 + 1) {
    pass = (bool)(pass & new_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6] ==
                         compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6]);
  }
  for (; compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start !=
         compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
      compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    *compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = 0.0;
  }
  state.adaptive_stepsize = 0.2;
  if (((~pass | verbose) & 1U) != 0) {
    reportPassFail(pass,"Gradient Descent","State Unit Tests");
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&new_x.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&compare_x.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&this->super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dummy_x.super__Vector_base<double,_std::allocator<double>_>);
  return pass;
}

Assistant:

bool testGradientDescentState(bool verbose) {
    test_result test;

    // Check contructor.
    size_t num_dimensions = 5;
    std::vector<double> dummy_x(num_dimensions, 1);
    GradientDescentState state = GradientDescentState(dummy_x, 0.1);
    test.tassert(num_dimensions == state.getNumDimensions());
    test.tassert(state.getAdaptiveStepsize() == 0.1);
    test.tassert(state.getX().size() == num_dimensions);

    // Check getters and coverters.
    std::vector<double> compare_x = state.getX();
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(compare_x[i] == dummy_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    state.getX(compare_x.data());
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(compare_x[i] == dummy_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    compare_x = state;
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(compare_x[i] == dummy_x[i]);

    // Check setters.
    std::vector<double> new_x(num_dimensions, 2);
    state.setX(new_x);
    compare_x = state;
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(new_x[i] == compare_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    state.setX(new_x.data());
    compare_x = state;
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(new_x[i] == compare_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    state.setAdaptiveStepsize(0.2);
    test.tassert(state.getAdaptiveStepsize() == 0.2);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Gradient Descent", "State Unit Tests");
    return test.success();
}